

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O3

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>_> *this,
          TPZVec<long> *nodeindices,int matind,TPZGeoMesh *mesh)

{
  long lVar1;
  
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZSavable_018943b0;
  TPZGeoEl::TPZGeoEl(&this->super_TPZGeoEl,&PTR_PTR_0188f8c0,matind,mesh);
  *(undefined ***)&this->super_TPZGeoEl = &PTR__TPZGeoElRefLess_0188f5c0;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::TPZGeoBlend(&this->fGeo,nodeindices);
  lVar1 = 0x3e0;
  do {
    *(undefined ***)
     ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
     lVar1 + -0x58) = &PTR__TPZGeoElSideIndex_0187bb90;
    *(undefined4 *)
     ((long)(this->fGeo).super_TPZGeoLinear.super_TPZNodeRep<2,_pztopology::TPZLine>.fNodeIndexes +
     lVar1 + -0x48) = 0xffffffff;
    *(undefined8 *)((long)(&(this->fGeo).super_TPZGeoLinear + -3) + lVar1) = 0xffffffffffffffff;
    lVar1 = lVar1 + 0x18;
  } while (lVar1 != 0x428);
  this->fNeighbours[0].fGeoElIndex = -1;
  this->fNeighbours[0].fSide = -1;
  this->fNeighbours[1].fGeoElIndex = -1;
  this->fNeighbours[1].fSide = -1;
  this->fNeighbours[2].fGeoElIndex = -1;
  this->fNeighbours[2].fSide = -1;
  pzgeom::TPZGeoBlend<pzgeom::TPZGeoLinear>::Initialize(&this->fGeo,&this->super_TPZGeoEl);
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess(TPZVec<int64_t> &nodeindices,int matind,TPZGeoMesh &mesh) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId), TPZGeoEl(matind,mesh), fGeo(nodeindices) {
	
	int i;
	for(i=0;i<TGeo::NSides;i++)fNeighbours[i] = TPZGeoElSideIndex();
    fGeo.Initialize(this);
}